

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O3

MPP_RET hal_h265e_v510_deinit(void *hal)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  HalH265eVepu510Tune *t;
  
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x40f);
  }
  if (*(void **)((long)hal + 0xa0) != (void *)0x0) {
    mpp_osal_free("hal_h265e_v510_deinit",*(void **)((long)hal + 0xa0));
  }
  *(undefined8 *)((long)hal + 0xa0) = 0;
  if (*(void **)((long)hal + 0x3c0) != (void *)0x0) {
    mpp_osal_free("hal_h265e_v510_deinit",*(void **)((long)hal + 0x3c0));
  }
  *(undefined8 *)((long)hal + 0x3c0) = 0;
  hal_bufs_deinit(*(HalBufs *)((long)hal + 0x3e0));
  iVar3 = *(int *)((long)hal + 0xb4);
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      lVar1 = *(long *)((long)hal + lVar4 * 8 + 0x80);
      if (lVar1 != 0) {
        if (*(MppBuffer *)(lVar1 + 0x1b0) != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller(*(MppBuffer *)(lVar1 + 0x1b0),"hal_h265e_v510_deinit");
          *(undefined8 *)(lVar1 + 0x1b0) = 0;
          *(undefined4 *)(lVar1 + 0x1b8) = 0;
        }
        if (*(void **)(lVar1 + 0x1c0) != (void *)0x0) {
          mpp_osal_free("hal_h265e_v510_deinit",*(void **)(lVar1 + 0x1c0));
        }
        *(undefined8 *)(lVar1 + 0x1c0) = 0;
        if (*(MppDevRegOffCfgs **)(lVar1 + 0x1c8) != (MppDevRegOffCfgs *)0x0) {
          mpp_dev_multi_offset_deinit(*(MppDevRegOffCfgs **)(lVar1 + 0x1c8));
          *(undefined8 *)(lVar1 + 0x1c8) = 0;
        }
        if (*(void **)(lVar1 + 0x18) != (void *)0x0) {
          mpp_osal_free("hal_h265e_v510_deinit",*(void **)(lVar1 + 0x18));
        }
        *(undefined8 *)(lVar1 + 0x18) = 0;
        if (*(void **)(lVar1 + 0x20) != (void *)0x0) {
          mpp_osal_free("hal_h265e_v510_deinit",*(void **)(lVar1 + 0x20));
        }
        *(undefined8 *)(lVar1 + 0x20) = 0;
        pvVar2 = *(void **)((long)hal + lVar4 * 8 + 0x80);
        if (pvVar2 != (void *)0x0) {
          mpp_osal_free("hal_h265e_v510_deinit",pvVar2);
        }
        *(undefined8 *)((long)hal + lVar4 * 8 + 0x80) = 0;
        iVar3 = *(int *)((long)hal + 0xb4);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  clear_ext_line_bufs((H265eV510HalContext *)hal);
  if (*(MppBufferGroup *)((long)hal + 0x3f8) != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x3f8));
    *(undefined8 *)((long)hal + 0x3f8) = 0;
  }
  if (*(MppBuffer *)((long)hal + 0x410) != (MppBuffer)0x0) {
    mpp_buffer_put_with_caller(*(MppBuffer *)((long)hal + 0x410),"hal_h265e_v510_deinit");
    *(undefined8 *)((long)hal + 0x410) = 0;
  }
  if (*(MppDev *)((long)hal + 0x68) != (MppDev)0x0) {
    mpp_dev_deinit(*(MppDev *)((long)hal + 0x68));
    *(undefined8 *)((long)hal + 0x68) = 0;
  }
  if (*(MppDevRegOffCfgs **)((long)hal + 0x398) != (MppDevRegOffCfgs *)0x0) {
    mpp_dev_multi_offset_deinit(*(MppDevRegOffCfgs **)((long)hal + 0x398));
    *(undefined8 *)((long)hal + 0x398) = 0;
  }
  if (*(MppBufferGroup *)((long)hal + 0x380) != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(*(MppBufferGroup *)((long)hal + 0x380));
    *(undefined8 *)((long)hal + 0x380) = 0;
  }
  pvVar2 = *(void **)((long)hal + 0x428);
  if (pvVar2 != (void *)0x0) {
    if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
      mpp_osal_free("vepu510_h265e_tune_deinit",*(void **)((long)pvVar2 + 8));
    }
    *(undefined8 *)((long)pvVar2 + 8) = 0;
    mpp_osal_free("vepu510_h265e_tune_deinit",pvVar2);
    *(undefined8 *)((long)hal + 0x428) = 0;
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) leave\n",(char *)0x0,0x44c);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v510_deinit(void *hal)
{
    H265eV510HalContext *ctx = (H265eV510HalContext *)hal;
    RK_S32 i = 0;

    hal_h265e_enter();
    MPP_FREE(ctx->poll_cfgs);
    MPP_FREE(ctx->input_fmt);
    hal_bufs_deinit(ctx->dpb_bufs);

    for (i = 0; i < ctx->task_cnt; i++) {
        Vepu510H265eFrmCfg *frm = ctx->frms[i];

        if (!frm)
            continue;

        if (frm->roir_buf) {
            mpp_buffer_put(frm->roir_buf);
            frm->roir_buf = NULL;
            frm->roir_buf_size = 0;
        }

        MPP_FREE(frm->roi_base_cfg_sw_buf);

        if (frm->reg_cfg) {
            mpp_dev_multi_offset_deinit(frm->reg_cfg);
            frm->reg_cfg = NULL;
        }

        MPP_FREE(frm->regs_set);
        MPP_FREE(frm->regs_ret);
        MPP_FREE(ctx->frms[i]);
    }

    clear_ext_line_bufs(ctx);

    if (ctx->ext_line_buf_grp) {
        mpp_buffer_group_put(ctx->ext_line_buf_grp);
        ctx->ext_line_buf_grp = NULL;
    }

    if (ctx->buf_pass1) {
        mpp_buffer_put(ctx->buf_pass1);
        ctx->buf_pass1 = NULL;
    }

    if (ctx->dev) {
        mpp_dev_deinit(ctx->dev);
        ctx->dev = NULL;
    }

    if (ctx->reg_cfg) {
        mpp_dev_multi_offset_deinit(ctx->reg_cfg);
        ctx->reg_cfg = NULL;
    }

    if (ctx->roi_grp) {
        mpp_buffer_group_put(ctx->roi_grp);
        ctx->roi_grp = NULL;
    }

    if (ctx->tune) {
        vepu510_h265e_tune_deinit(ctx->tune);
        ctx->tune = NULL;
    }

    hal_h265e_leave();
    return MPP_OK;
}